

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingerprint.cpp
# Opt level: O1

string * libtorrent::generate_fingerprint
                   (string *__return_storage_ptr__,string *name,int major,int minor,int revision,
                   int tag)

{
  byte bVar1;
  
  if ((char *)name->_M_string_length < (char *)0x2) {
    ::std::__cxx11::string::_M_replace((ulong)name,0,(char *)name->_M_string_length,0x3ff4a3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,'\b');
  *(__return_storage_ptr__->_M_dataplus)._M_p = '-';
  (__return_storage_ptr__->_M_dataplus)._M_p[1] = *(name->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p[2] = (name->_M_dataplus)._M_p[1];
  if ((uint)major < 10) {
    bVar1 = (byte)major | 0x30;
  }
  else {
    bVar1 = 0x30;
    if (9 < major) {
      bVar1 = (byte)major + 0x37;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p[3] = bVar1;
  if ((uint)minor < 10) {
    bVar1 = (byte)minor | 0x30;
  }
  else {
    bVar1 = 0x30;
    if (9 < minor) {
      bVar1 = (byte)minor + 0x37;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p[4] = bVar1;
  if ((uint)revision < 10) {
    bVar1 = (byte)revision | 0x30;
  }
  else {
    bVar1 = 0x30;
    if (9 < revision) {
      bVar1 = (byte)revision + 0x37;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p[5] = bVar1;
  if ((uint)tag < 10) {
    bVar1 = (byte)tag | 0x30;
  }
  else {
    bVar1 = 0x30;
    if (9 < tag) {
      bVar1 = (byte)tag + 0x37;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p[6] = bVar1;
  (__return_storage_ptr__->_M_dataplus)._M_p[7] = '-';
  return __return_storage_ptr__;
}

Assistant:

std::string generate_fingerprint(std::string name, int const major
		, int const minor
		, int const revision
		, int const tag)
	{
		TORRENT_ASSERT_PRECOND(major >= 0);
		TORRENT_ASSERT_PRECOND(minor >= 0);
		TORRENT_ASSERT_PRECOND(revision >= 0);
		TORRENT_ASSERT_PRECOND(tag >= 0);
		TORRENT_ASSERT_PRECOND(name.size() == 2);
		if (name.size() < 2) name = "--";

		std::string ret;
		ret.resize(8);
		ret[0] = '-';
		ret[1] = name[0];
		ret[2] = name[1];
		ret[3] = version_to_char(major);
		ret[4] = version_to_char(minor);
		ret[5] = version_to_char(revision);
		ret[6] = version_to_char(tag);
		ret[7] = '-';
		return ret;
	}